

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastF64P1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint32_t size;
  uint *puVar1;
  RepeatedField<unsigned_long> *out;
  char *pcVar2;
  char *local_28;
  
  if (data.field_0._0_1_ == '\0') {
    local_28 = ptr + 1;
    if ((ulong)table->has_bits_offset != 0) {
      puVar1 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
      *puVar1 = *puVar1 | (uint)hasbits;
    }
    out = RefAt<google::protobuf::RepeatedField<unsigned_long>>(msg,(ulong)data.field_0 >> 0x30);
    size = ReadSize(&local_28);
    pcVar2 = EpsCopyInputStream::ReadPackedFixed<unsigned_long>
                       (&ctx->super_EpsCopyInputStream,local_28,size,out);
    return pcVar2;
  }
  pcVar2 = MiniParse(msg,ptr,ctx,data,table,hasbits);
  return pcVar2;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastF64P1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return PackedFixed<uint64_t, uint8_t>(
      PROTOBUF_TC_PARAM_PASS);
}